

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtrAbc.c
# Opt level: O3

Vec_Ptr_t * Ptr_AbcDeriveNode(Abc_Obj_t *pObj)

{
  Abc_NtkFunc_t AVar1;
  Abc_Obj_t *pObj_00;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  size_t __size;
  
  uVar10 = (pObj->vFanins).nSize * 2 + 4;
  if ((int)uVar10 < 0) {
    __assert_fail("nCap >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
  }
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nSize = 0;
  pVVar3->nCap = uVar10;
  if (uVar10 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((ulong)uVar10 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x72,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
  }
  AVar1 = pObj->pNtk->ntkFunc;
  if (AVar1 == ABC_FUNC_SOP) {
    pcVar5 = *(char **)&(pObj->field_5).iData;
    iVar2 = strcmp(pcVar5," 0\n");
    if (iVar2 == 0) {
      pcVar6 = "BAC_BOX_C0";
    }
    else {
      iVar2 = strcmp(pcVar5," 1\n");
      if (iVar2 == 0) {
        pcVar6 = "BAC_BOX_C1";
      }
      else {
        iVar2 = strcmp(pcVar5,"1 1\n");
        if (iVar2 == 0) {
          pcVar6 = "BAC_BOX_BUF";
        }
        else {
          iVar2 = strcmp(pcVar5,"0 1\n");
          if (iVar2 == 0) {
            pcVar6 = "BAC_BOX_INV";
          }
          else {
            iVar2 = strcmp(pcVar5,"11 1\n");
            if (iVar2 == 0) {
              pcVar6 = "BAC_BOX_AND";
            }
            else {
              iVar2 = strcmp(pcVar5,"00 1\n");
              if (iVar2 == 0) {
                pcVar6 = "BAC_BOX_NOR";
              }
              else {
                iVar2 = strcmp(pcVar5,"00 0\n");
                pcVar6 = "BAC_BOX_OR";
                if (((iVar2 != 0) && (iVar2 = strcmp(pcVar5,"-1 1\n1- 1\n"), iVar2 != 0)) &&
                   (iVar2 = strcmp(pcVar5,"1- 1\n-1 1\n"), iVar2 != 0)) {
                  iVar2 = strcmp(pcVar5,"01 1\n10 1\n");
                  pcVar6 = "BAC_BOX_XOR";
                  if ((iVar2 != 0) && (iVar2 = strcmp(pcVar5,"10 1\n01 1\n"), iVar2 != 0)) {
                    iVar2 = strcmp(pcVar5,"11 1\n00 1\n");
                    pcVar6 = "BAC_BOX_XNOR";
                    if ((iVar2 != 0) && (iVar2 = strcmp(pcVar5,"00 1\n11 1\n"), iVar2 != 0)) {
                      iVar2 = strcmp(pcVar5,"10 1\n");
                      if (iVar2 == 0) {
                        pcVar6 = "BAC_BOX_SHARP";
                      }
                      else {
                        iVar2 = strcmp(pcVar5,"01 1\n");
                        if (iVar2 != 0) {
                          __assert_fail("0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bac.h"
                                        ,0x396,"char *Ptr_SopToTypeName(char *)");
                        }
                        pcVar6 = "BAC_BOX_SHARPL";
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (uVar10 == 0) {
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,0x80);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = 0x10;
      uVar10 = 0x10;
    }
    *ppvVar4 = pcVar6;
  }
  else {
    if (AVar1 != ABC_FUNC_AIG) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                    ,0x77,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
    }
    pcVar5 = Ptr_HopToType(pObj);
    if (uVar10 == 0) {
      if (ppvVar4 == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(ppvVar4,0x80);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = 0x10;
      uVar10 = 0x10;
    }
    *ppvVar4 = pcVar5;
  }
  pcVar5 = Ptr_AbcObjName(pObj);
  pVVar3->nSize = 2;
  pVVar3->pArray[1] = pcVar5;
  iVar2 = (pObj->vFanins).nSize;
  if (2 < iVar2) {
    __assert_fail("Abc_ObjFaninNum(pObj) <= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x79,"Vec_Ptr_t *Ptr_AbcDeriveNode(Abc_Obj_t *)");
  }
  if (iVar2 < 1) {
    uVar9 = 2;
  }
  else {
    uVar8 = 2;
    __size = 0x30;
    lVar7 = 0;
    lVar11 = 0;
    do {
      pObj_00 = (Abc_Obj_t *)
                pObj->pNtk->vObjs->pArray[*(int *)((long)(pObj->vFanins).pArray + lVar7)];
      pcVar5 = " TXr; >Xrs Yqo o!Yq oHYq oqYa 7Yq Y87q 7HYq Ya7q SoYq YqoS! oZYq YqaoZ rY r";
      if (lVar7 == 0) {
        pcVar5 = "*?BN -ke?aN ke*?1N :ek?-N ke?B1*N ak:e?-N ?Qke* ?-Qke Qke?T* ?Qe-Tk l?Qe* l";
      }
      uVar9 = (uint)uVar8;
      if (uVar9 == uVar10) {
        ppvVar4 = pVVar3->pArray;
        if (uVar8 < 0x10) {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          pVVar3->pArray = ppvVar4;
          uVar10 = 0x10;
        }
        else {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(__size - 0x10);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,__size - 0x10);
          }
          pVVar3->pArray = ppvVar4;
          uVar10 = (int)lVar7 + 4;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      *(char **)((long)ppvVar4 + lVar7 * 4 + 0x10) = pcVar5 + 0x4a;
      pcVar5 = Ptr_AbcObjName(pObj_00);
      if (uVar10 == uVar9 + 1) {
        ppvVar4 = pVVar3->pArray;
        if (uVar8 < 0xf) {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          pVVar3->pArray = ppvVar4;
          uVar10 = 0x10;
        }
        else {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(__size);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,__size);
          }
          pVVar3->pArray = ppvVar4;
          uVar10 = (int)lVar7 + 6;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      *(char **)((long)ppvVar4 + lVar7 * 4 + 0x18) = pcVar5;
      lVar11 = lVar11 + 1;
      lVar7 = lVar7 + 4;
      __size = __size + 0x20;
      uVar8 = uVar8 + 2;
    } while (lVar11 < (pObj->vFanins).nSize);
    uVar9 = uVar9 + 2;
    pVVar3->nSize = uVar9;
    pVVar3->nCap = uVar10;
  }
  if (uVar9 == uVar10) {
    if ((int)uVar10 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = 0x10;
      uVar10 = 0x10;
    }
    else {
      uVar10 = uVar10 * 2;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar10 * 8);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar10 * 8);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = uVar10;
    }
  }
  else {
    ppvVar4 = pVVar3->pArray;
  }
  ppvVar4[(int)uVar9] = "o";
  pcVar5 = Ptr_AbcObjName(pObj);
  if (uVar9 + 1 == uVar10) {
    if ((int)uVar9 < 0xf) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = 0x10;
      uVar10 = 0x10;
    }
    else {
      uVar10 = uVar10 * 2;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar10 * 8);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar10 * 8);
      }
      pVVar3->pArray = ppvVar4;
      pVVar3->nCap = uVar10;
    }
  }
  else {
    ppvVar4 = pVVar3->pArray;
  }
  pVVar3->nSize = uVar9 + 2;
  ppvVar4[(int)(uVar9 + 1)] = pcVar5;
  if (uVar9 + 2 != uVar10) {
    __assert_fail("Vec_PtrSize(vArray) == Vec_PtrCap(vArray)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPtrAbc.c"
                  ,0x6b,"int Ptr_CheckArray(Vec_Ptr_t *)");
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Ptr_AbcDeriveNode( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin; int i;
    Vec_Ptr_t * vNode = Vec_PtrAllocExact( 2 + 2 * (1 + Abc_ObjFaninNum(pObj)) );
    assert( Abc_ObjIsNode(pObj) );
    if ( Abc_NtkHasAig(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_HopToType(pObj) );
    else if ( Abc_NtkHasSop(pObj->pNtk) )
        Vec_PtrPush( vNode, Ptr_SopToTypeName((char *)pObj->pData) );
    else assert( 0 );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Abc_ObjFaninNum(pObj) <= 2 );
    Abc_ObjForEachFanin( pObj, pFanin, i )
    {
        Vec_PtrPush( vNode, (void*)(i ? "r" : "l") );
        Vec_PtrPush( vNode, Ptr_AbcObjName(pFanin) );
    }
    Vec_PtrPush( vNode, (void*)("o") );
    Vec_PtrPush( vNode, Ptr_AbcObjName(pObj) );
    assert( Ptr_CheckArray(vNode) );
    return vNode;
}